

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

word Dau_Dsd6ToTruth(char *p)

{
  word wVar1;
  char *in_RDI;
  char *local_10;
  
  local_10 = in_RDI;
  if (*in_RDI == '1') {
    if (in_RDI[1] == '\0') {
      wVar1 = 0xffffffffffffffff;
      goto LAB_004b321f;
    }
  }
  else if ((*in_RDI == '0') && (in_RDI[1] == '\0')) {
    wVar1 = 0;
    goto LAB_004b321f;
  }
  Dau_DsdComputeMatches(in_RDI);
  wVar1 = Dau_Dsd6ToTruth_rec(in_RDI,&local_10,Dau_DsdComputeMatches::pMatches,s_Truths6);
LAB_004b321f:
  if (local_10[1] == '\0') {
    return wVar1;
  }
  local_10 = local_10 + 1;
  __assert_fail("*++p == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                ,0x1c6,"word Dau_Dsd6ToTruth(char *)");
}

Assistant:

word Dau_Dsd6ToTruth( char * p )
{
    word Res;
    if ( *p == '0' && *(p+1) == 0 )
        Res = 0;
    else if ( *p == '1' && *(p+1) == 0 )
        Res = ~(word)0;
    else
        Res = Dau_Dsd6ToTruth_rec( p, &p, Dau_DsdComputeMatches(p), s_Truths6 );
    assert( *++p == 0 );
    return Res;
}